

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O0

void loader_impl_destroy_handle(loader_handle_impl handle_impl)

{
  int iVar1;
  size_t sVar2;
  long *plVar3;
  vector in_RDI;
  loader_handle_impl populated_handle_impl;
  size_t iterator;
  vector in_stack_ffffffffffffffc8;
  vector pvVar4;
  char *in_stack_ffffffffffffffd0;
  char *in_stack_fffffffffffffff0;
  ulong uVar5;
  ulong uVar6;
  
  if (in_RDI != (vector)0x0) {
    if (*(int *)&((scope)in_RDI->capacity)->objects == 0) {
      iVar1 = loader_impl_function_hook_call((context)in_RDI,in_stack_fffffffffffffff0);
      pvVar4 = in_RDI;
      if (iVar1 != 0) {
        in_stack_ffffffffffffffd0 = "__metacall_finalize__";
        log_write_impl_va("metacall",0x27d,"loader_impl_destroy_handle",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                          ,LOG_LEVEL_ERROR,"Error when calling destructor from handle impl: %p (%s)"
                         );
        in_stack_ffffffffffffffc8 = in_RDI;
      }
      in_RDI = pvVar4;
      if ((pvVar4[0x80].data != (void *)0x0) &&
         (iVar1 = (**(code **)(pvVar4->size + 0x28))((scope)pvVar4->capacity,pvVar4[0x80].data),
         in_RDI = pvVar4, iVar1 != 0)) {
        log_write_impl_va("metacall",0x282,"loader_impl_destroy_handle",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                          ,LOG_LEVEL_ERROR,"Error when clearing handle impl: %p");
        in_stack_ffffffffffffffc8 = pvVar4;
      }
    }
    if (*(int *)&in_RDI[0x81].capacity == 0) {
      context_remove((context)in_stack_ffffffffffffffd0,(context)in_stack_ffffffffffffffc8);
    }
    uVar5 = 0;
    while (uVar6 = uVar5, sVar2 = vector_size((vector)in_RDI[0x81].size), uVar5 < sVar2) {
      plVar3 = (long *)vector_at(in_stack_ffffffffffffffc8,0x1314bc);
      if (*(int *)(*plVar3 + 0x1028) == 0) {
        context_remove((context)in_stack_ffffffffffffffd0,(context)in_stack_ffffffffffffffc8);
      }
      context_remove((context)in_stack_ffffffffffffffd0,(context)in_stack_ffffffffffffffc8);
      uVar5 = uVar6 + 1;
    }
    context_destroy((context)0x131531);
    vector_destroy((vector)0x131542);
    in_RDI->type_size = (size_t)"loader_handle_impl_magic_free";
    free(in_RDI);
  }
  return;
}

Assistant:

void loader_impl_destroy_handle(loader_handle_impl handle_impl)
{
	if (handle_impl != NULL)
	{
		static const char func_fini_name[] = LOADER_IMPL_FUNCTION_FINI;
		size_t iterator;

		if (handle_impl->impl->init == 0)
		{
			/* TODO: Disable logs here until log is completely thread safe and async signal safe */
			/* log_write("metacall", LOG_LEVEL_DEBUG, "Destroying handle %s", handle_impl->path); */

			if (loader_impl_function_hook_call(handle_impl->ctx, func_fini_name) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Error when calling destructor from handle impl: %p (%s)", (void *)handle_impl, func_fini_name);
			}

			if (handle_impl->module != NULL && handle_impl->iface->clear(handle_impl->impl, handle_impl->module) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Error when clearing handle impl: %p", (void *)handle_impl);
			}
		}

		if (handle_impl->populated == 0)
		{
			context_remove(handle_impl->impl->ctx, handle_impl->ctx);
		}

		for (iterator = 0; iterator < vector_size(handle_impl->populated_handles); ++iterator)
		{
			loader_handle_impl populated_handle_impl = vector_at_type(handle_impl->populated_handles, iterator, loader_handle_impl);

			if (populated_handle_impl->populated == 0)
			{
				context_remove(populated_handle_impl->impl->ctx, handle_impl->ctx);
			}

			context_remove(populated_handle_impl->ctx, handle_impl->ctx);
		}

		context_destroy(handle_impl->ctx);
		vector_destroy(handle_impl->populated_handles);
		handle_impl->magic = (uintptr_t)loader_handle_impl_magic_free;

		free(handle_impl);
	}
}